

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this,Flags resultDisposition)

{
  ExpressionResultBuilder *pEVar1;
  Catch local_38 [35];
  byte local_15;
  Flags local_14;
  bool value;
  ExpressionLhs<bool> *pEStack_10;
  Flags resultDisposition_local;
  ExpressionLhs<bool> *this_local;
  
  local_15 = this->m_lhs & 1;
  local_14 = resultDisposition;
  pEStack_10 = this;
  toString_abi_cxx11_(local_38,(bool)local_15);
  pEVar1 = ExpressionResultBuilder::setLhs(&this->m_result,(string *)local_38);
  pEVar1 = ExpressionResultBuilder::setResultType(pEVar1,(bool)(local_15 & 1));
  pEVar1 = ExpressionResultBuilder::endExpression(pEVar1,local_14);
  std::__cxx11::string::~string((string *)local_38);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& endExpression( ResultDisposition::Flags resultDisposition ) {
        bool value = m_lhs ? true : false;
        return m_result
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression( resultDisposition );
    }